

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O2

ValueInfo * __thiscall
GlobOpt::UpdateIntBoundsForGreaterThanOrEqual
          (GlobOpt *this,Value *value,IntConstantBounds *constantBounds,Value *boundValue,
          IntConstantBounds *boundConstantBounds,int boundOffset,bool isExplicit)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IntBounds *this_00;
  IntBoundedValueInfo *pIVar5;
  ValueInfo *pVVar6;
  int local_38;
  int local_34;
  int32 adjustedBoundMin;
  
  local_34 = boundOffset;
  if (value == (Value *)0x0) {
    if (constantBounds->lowerBound != constantBounds->upperBound) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x228,"(value || constantBounds.IsConstant())",
                         "value || constantBounds.IsConstant()");
      if (!bVar3) goto LAB_0047229c;
      *puVar4 = 0;
    }
    if (boundValue != (Value *)0x0) {
      return (ValueInfo *)0x0;
    }
  }
  else if (boundValue != (Value *)0x0) {
    if (value->valueNumber == boundValue->valueNumber) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x22e,
                         "(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber())",
                         "!boundValue || value->GetValueNumber() != boundValue->GetValueNumber()");
      if (!bVar3) goto LAB_0047229c;
      *puVar4 = 0;
      bVar3 = false;
    }
    else {
      bVar3 = false;
    }
    goto LAB_00472187;
  }
  if (boundConstantBounds->lowerBound != boundConstantBounds->upperBound) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x229,"(boundValue || boundConstantBounds.IsConstant())",
                       "boundValue || boundConstantBounds.IsConstant()");
    if (!bVar3) {
LAB_0047229c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  bVar3 = true;
  if (value == (Value *)0x0) {
    return (ValueInfo *)0x0;
  }
LAB_00472187:
  pVVar6 = value->valueInfo;
  this_00 = GetIntBoundsToUpdate
                      (this,pVVar6,constantBounds,true,
                       boundConstantBounds->lowerBound == boundConstantBounds->upperBound,false,
                       isExplicit);
  if (this_00 != (IntBounds *)0x0) {
    if (bVar3) {
      IntBounds::SetLowerBound(this_00,boundConstantBounds->lowerBound,local_34);
    }
    else {
      IntBounds::SetLowerBound(this_00,value->valueNumber,boundValue,local_34,isExplicit);
    }
    bVar3 = IntBounds::RequiresIntBoundedValueInfo
                      (this_00,(ValueType)
                               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                &(pVVar6->super_ValueType).field_0.field_0);
    if (bVar3) {
      pIVar5 = NewIntBoundedValueInfo(this,pVVar6,this_00);
      return &pIVar5->super_ValueInfo;
    }
    IntBounds::Delete(this_00);
  }
  bVar3 = ValueType::IsInt(&pVVar6->super_ValueType);
  if (bVar3) {
    iVar1 = boundConstantBounds->lowerBound;
    if (local_34 == 1) {
      if (iVar1 == 0x7fffffff) {
        return (ValueInfo *)0x0;
      }
      iVar1 = iVar1 + 1;
    }
    else if ((local_34 != 0) &&
            (bVar3 = Int32Math::Add(iVar1,local_34,&local_38), iVar1 = local_38, bVar3)) {
      return (ValueInfo *)0x0;
    }
    local_38 = iVar1;
    iVar1 = local_38;
    if (local_38 < constantBounds->lowerBound) {
      iVar1 = constantBounds->lowerBound;
    }
    if (iVar1 <= constantBounds->upperBound) {
      pVVar6 = NewIntRangeValueInfo(this,pVVar6,iVar1,constantBounds->upperBound);
      return pVVar6;
    }
  }
  return (ValueInfo *)0x0;
}

Assistant:

ValueInfo *GlobOpt::UpdateIntBoundsForGreaterThanOrEqual(
    Value *const value,
    const IntConstantBounds &constantBounds,
    Value *const boundValue,
    const IntConstantBounds &boundConstantBounds,
    const int boundOffset,
    const bool isExplicit)
{
    Assert(value || constantBounds.IsConstant());
    Assert(boundValue || boundConstantBounds.IsConstant());
    if(!value)
    {
        return nullptr;
    }
    Assert(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber());

    ValueInfo *const valueInfo = value->GetValueInfo();
    IntBounds *const bounds =
        GetIntBoundsToUpdate(valueInfo, constantBounds, true, boundConstantBounds.IsConstant(), false, isExplicit);
    if(bounds)
    {
        if(boundValue)
        {
            bounds->SetLowerBound(value->GetValueNumber(), boundValue, boundOffset, isExplicit);
        }
        else
        {
            bounds->SetLowerBound(boundConstantBounds.LowerBound(), boundOffset);
        }
        if(bounds->RequiresIntBoundedValueInfo(valueInfo->Type()))
        {
            return NewIntBoundedValueInfo(valueInfo, bounds);
        }
        bounds->Delete();
    }

    if(!valueInfo->IsInt())
    {
        return nullptr;
    }

    int32 adjustedBoundMin;
    if(boundOffset == 0)
    {
        adjustedBoundMin = boundConstantBounds.LowerBound();
    }
    else if(boundOffset == 1)
    {
        if(boundConstantBounds.LowerBound() + 1 <= boundConstantBounds.LowerBound())
        {
            return nullptr;
        }
        adjustedBoundMin = boundConstantBounds.LowerBound() + 1;
    }
    else if(Int32Math::Add(boundConstantBounds.LowerBound(), boundOffset, &adjustedBoundMin))
    {
        return nullptr;
    }
    const int32 newMin = max(constantBounds.LowerBound(), adjustedBoundMin);
    return
        newMin <= constantBounds.UpperBound()
            ? NewIntRangeValueInfo(valueInfo, newMin, constantBounds.UpperBound())
            : nullptr;
}